

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Al.cpp
# Opt level: O0

void Al::Initialize(int *argc,char ***argv,MPI_Comm world_comm)

{
  initializer_list<int> __l;
  bool bVar1;
  allocator_type *paVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  reference piVar4;
  EVP_PKEY_CTX *in_RDI;
  int *sig;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> handled_signals;
  char *env;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *__lhs;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  bool local_c9;
  allocator<char> *in_stack_ffffffffffffff40;
  iterator in_stack_ffffffffffffff48;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff50;
  undefined1 local_99 [9];
  undefined8 uStack_90;
  undefined4 local_88;
  ProgressEngine *in_stack_ffffffffffffff80;
  allocator<char> local_51;
  string local_50 [32];
  vector<int,_std::allocator<int>_> *local_30;
  
  if (((anonymous_namespace)::is_initialized & 1) == 0) {
    internal::mpi::init(in_RDI);
    paVar2 = (allocator_type *)operator_new(0x8100,0x80);
    internal::ProgressEngine::ProgressEngine(in_stack_ffffffffffffff80);
    (anonymous_namespace)::progress_engine = paVar2;
    (anonymous_namespace)::is_initialized = 1;
    paVar2 = (anonymous_namespace)::progress_engine;
    pvVar3 = (vector<int,_std::allocator<int>_> *)getenv("AL_DISABLE_SIGNAL_HANDLER");
    local_c9 = true;
    local_30 = pvVar3;
    if (pvVar3 != (vector<int,_std::allocator<int>_> *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff50._M_current,(char *)in_stack_ffffffffffffff48,
                 in_stack_ffffffffffffff40);
      local_c9 = std::operator==(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator(&local_51);
      in_stack_ffffffffffffff20 = pvVar3;
    }
    if (local_c9 != false) {
      local_99._1_8_ = 0x600000004;
      uStack_90 = 0x700000008;
      local_88 = 0xb;
      __lhs = (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)local_99;
      std::allocator<int>::allocator((allocator<int> *)0x12c662);
      __l._M_len = (size_type)in_stack_ffffffffffffff50._M_current;
      __l._M_array = in_stack_ffffffffffffff48;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40,__l,paVar2);
      std::allocator<int>::~allocator((allocator<int> *)0x12c68d);
      Initialize::sa.__sigaction_handler.sa_handler = anon_unknown_1::handle_signal;
      Initialize::sa.sa_flags = 0x10000000;
      sigfillset((sigset_t *)&Initialize::sa.sa_mask);
      std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff08);
      std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff08);
      while (bVar1 = __gnu_cxx::operator!=
                               (__lhs,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)in_stack_ffffffffffffff08), bVar1) {
        piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)&stack0xffffffffffffff50);
        sigaction(*piVar4,(sigaction *)&Initialize::sa,(sigaction *)0x0);
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   &stack0xffffffffffffff50);
      }
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff20);
    }
  }
  return;
}

Assistant:

void Initialize(int& argc, char**& argv, MPI_Comm world_comm) {
  // Avoid repeated initialization.
  if (is_initialized) {
    return;
  }
  internal::mpi::init(argc, argv, world_comm);
  progress_engine = new internal::ProgressEngine();
#ifndef AL_PE_START_ON_DEMAND
  progress_engine->run();
#endif
  is_initialized = true;
#ifdef AL_HAS_CUDA
  internal::cuda::init(argc, argv);
#endif
#ifdef AL_HAS_NCCL
  internal::nccl::init(argc, argv);
#endif
#ifdef AL_HAS_MPI_CUDA
  internal::mpi_cuda::init(argc, argv);
#endif
#ifdef AL_HAS_HOST_TRANSFER
  internal::ht::init(argc, argv);
#endif

#ifdef AL_SIGNAL_HANDLER
  // Set AL_DISABLE_SIGNAL_HANDLER to a non-zero value to disable it.
  if (const char* env = std::getenv("AL_DISABLE_SIGNAL_HANDLER");
      env == nullptr || std::string(env) == "0") {
    // Add signal handlers.
    const std::vector<int> handled_signals = {SIGILL, SIGABRT, SIGFPE,
                                              SIGBUS, SIGSEGV};
    static struct sigaction sa;
    sa.sa_handler = &handle_signal;
    sa.sa_flags = SA_RESTART;
    sigfillset(&sa.sa_mask);
    for (const auto& sig : handled_signals) {
      sigaction(sig, &sa, nullptr);
    }
  }
#endif  // AL_SIGNAL_HANDLER
}